

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeywordExtractor.hpp
# Opt level: O1

void __thiscall
cppjieba::KeywordExtractor::KeywordExtractor
          (KeywordExtractor *this,DictTrie *dictTrie,HMMModel *model,string *idfPath,
          string *stopWordPath)

{
  MixSegment::MixSegment(&this->segment_,dictTrie,model);
  (this->idfMap_)._M_h._M_buckets = &(this->idfMap_)._M_h._M_single_bucket;
  (this->idfMap_)._M_h._M_bucket_count = 1;
  (this->idfMap_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->idfMap_)._M_h._M_element_count = 0;
  (this->idfMap_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->idfMap_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->idfMap_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->stopWords_)._M_h._M_buckets = &(this->stopWords_)._M_h._M_single_bucket;
  (this->stopWords_)._M_h._M_bucket_count = 1;
  (this->stopWords_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->stopWords_)._M_h._M_element_count = 0;
  (this->stopWords_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->stopWords_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->stopWords_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  LoadIdfDict(this,idfPath);
  LoadStopWordDict(this,stopWordPath);
  return;
}

Assistant:

KeywordExtractor(const DictTrie* dictTrie, 
        const HMMModel* model,
        const string& idfPath, 
        const string& stopWordPath) 
    : segment_(dictTrie, model) {
    LoadIdfDict(idfPath);
    LoadStopWordDict(stopWordPath);
  }